

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O3

string * anon_unknown.dwarf_294aa8::make_include_path
                   (string *__return_storage_ptr__,string *base_path,string *dest_path)

{
  pointer pcVar1;
  undefined8 uVar2;
  size_type sVar3;
  string *extraout_RAX;
  string *psVar4;
  string *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  sVar3 = std::__cxx11::string::rfind((char)base_path,0x2f);
  if (sVar3 == base_path->_M_string_length) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = (dest_path->_M_dataplus)._M_p;
    sVar3 = dest_path->_M_string_length;
  }
  else {
    sVar3 = dest_path->_M_string_length;
    if ((sVar3 == 0) || (pcVar6 = (dest_path->_M_dataplus)._M_p, *pcVar6 != '/')) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)base_path);
      psVar4 = (string *)
               std::__cxx11::string::_M_append
                         ((char *)local_40,(ulong)(dest_path->_M_dataplus)._M_p);
      paVar5 = &psVar4->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 == paVar5) {
        uVar2 = *(undefined8 *)((long)&psVar4->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = psVar4->_M_string_length;
      (psVar4->_M_dataplus)._M_p = (pointer)paVar5;
      psVar4->_M_string_length = 0;
      (psVar4->field_2)._M_local_buf[0] = '\0';
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
        psVar4 = extraout_RAX_00;
      }
      return psVar4;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar6,pcVar6 + sVar3);
  return extraout_RAX;
}

Assistant:

std::string make_include_path(const std::string& base_path, const std::string& dest_path)
{
    size_t last_slash_pos = base_path.find_last_of('/');

    if (last_slash_pos == base_path.length())
    {
        return dest_path;
    }

    if (dest_path.length() >= 1 && dest_path[0] == '/')
    {
        return dest_path;
    }

    return base_path.substr(0, last_slash_pos + 1) + dest_path;
}